

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

bool __thiscall
Rml::DataInterpreter::Execute
          (DataInterpreter *this,Instruction instruction,Variant *data,size_t *next_instruction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pDVar2;
  pointer pvVar3;
  pointer pVVar4;
  DataModel *this_00;
  code *pcVar5;
  pointer pDVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  string value;
  undefined4 uVar13;
  ulong uVar14;
  Variant *other;
  DataInterpreter *this_01;
  undefined8 uVar15;
  long lVar16;
  bool bVar17;
  double value_00;
  String function_name;
  DataAddress address;
  String arguments_str;
  Vector<Variant> arguments;
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_178 [40];
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar13 = local_1e0._4_4_;
  if (0x3b < (int)instruction) {
    switch(instruction) {
    case Less:
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
      uVar15 = local_1e0._0_8_;
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
      bVar8 = (double)local_1e0._0_8_ == (double)uVar15;
      bVar17 = (double)local_1e0._0_8_ < (double)uVar15;
      goto LAB_001f55e5;
    case Equal:
      if (((this->L).type != STRING) && ((this->R).type != STRING)) {
        local_1e0._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
        uVar15 = local_1e0._0_8_;
        local_1e0._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
        bVar8 = (double)uVar15 == (double)local_1e0._0_8_;
LAB_001f588d:
        value = (string)(-bVar8 & 1);
        goto LAB_001f5808;
      }
      local_d0._8_8_ = 0;
      local_c0._M_local_buf[0] = '\0';
      local_d0._M_allocated_capacity = (size_type)&local_c0;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->L,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity == &local_c0) {
        local_188._8_8_ = local_c0._8_8_;
        local_198._M_allocated_capacity = (size_type)&local_188;
      }
      else {
        local_198._M_allocated_capacity = local_d0._M_allocated_capacity;
      }
      local_188._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
      local_188._M_local_buf[0] = local_c0._M_local_buf[0];
      local_198._8_8_ = local_d0._8_8_;
      local_d0._8_8_ = 0;
      local_c0._M_local_buf[0] = '\0';
      pDVar2 = (pointer)(local_f0 + 0x10);
      local_f0._8_8_ = (pointer)0x0;
      local_f0[0x10] = '\0';
      local_f0._0_8_ = pDVar2;
      local_d0._M_allocated_capacity = (size_type)&local_c0;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f0);
      uVar15 = local_f0._8_8_;
      if ((pointer)local_f0._0_8_ == pDVar2) {
        local_1b8._24_8_ = local_f0._24_8_;
        local_f0._0_8_ = (pointer)(local_1b8 + 0x10);
      }
      local_1b8._17_7_ = local_f0._17_7_;
      local_1b8[0x10] = local_f0[0x10];
      local_1b8._8_8_ = local_f0._8_8_;
      local_f0._8_8_ = 0;
      local_f0[0x10] = '\0';
      local_1b8._0_8_ = local_f0._0_8_;
      if (local_198._8_8_ == uVar15) {
        if ((pointer)uVar15 == (pointer)0x0) {
          bVar8 = true;
          local_f0._0_8_ = pDVar2;
        }
        else {
          pDVar6 = (pointer)local_f0._0_8_;
          local_f0._0_8_ = pDVar2;
          iVar10 = bcmp((void *)local_198._M_allocated_capacity,pDVar6,uVar15);
          bVar8 = iVar10 == 0;
        }
      }
      else {
        bVar8 = false;
        local_f0._0_8_ = pDVar2;
      }
      local_1e0._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_1e0,bVar8);
      Variant::operator=(&this->R,(Variant *)local_1e0);
      Variant::~Variant((Variant *)local_1e0);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if ((pointer)local_f0._0_8_ != pDVar2) {
        operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity != &local_c0) {
        lVar16 = CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]);
        uVar15 = local_d0._M_allocated_capacity;
LAB_001f63c6:
        operator_delete((void *)uVar15,lVar16 + 1);
      }
      break;
    case Greater:
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
      uVar15 = local_1e0._0_8_;
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
      bVar8 = (double)uVar15 == (double)local_1e0._0_8_;
      bVar17 = (double)uVar15 < (double)local_1e0._0_8_;
LAB_001f55e5:
      value = (string)(!bVar17 && !bVar8);
      goto LAB_001f5808;
    case 0x3f:
    case 0x40:
    case 0x42:
    case 0x43:
    case 0x46:
    case 0x48:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x55:
    case 0x57:
    case 0x58:
switchD_001f522f_caseD_3f:
      bVar8 = Assert("Instruction not implemented.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0x465);
      if (!bVar8) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      break;
    case Assign:
      local_1e0._0_4_ = 0xffffffff;
      local_1e0._0_8_ = CONCAT44(uVar13,local_1e0._0_4_);
      Variant::GetInto<int,_0>(data,(int *)local_1e0);
      uVar11 = (ulong)(int)local_1e0._0_4_;
      pvVar3 = (this->addresses->
               super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->addresses->
                      super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
               -0x5555555555555555;
      if (uVar14 < uVar11 || uVar14 - uVar11 == 0) {
        local_1e0._0_8_ = local_1e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Variable address not found.","");
        bVar9 = Error(this,(String *)local_1e0);
      }
      else {
        bVar8 = DataExpressionInterface::SetValue
                          (&this->expression_interface,pvVar3 + uVar11,&this->R);
        if (bVar8) break;
        local_1e0._0_8_ = local_1e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Could not assign to variable.","");
        bVar9 = Error(this,(String *)local_1e0);
      }
      goto LAB_001f5ed6;
    case Literal:
      Variant::operator=(&this->R,data);
      break;
    case EventFnc:
    case TransformFnc:
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = (pointer)0x0;
      local_178._16_8_ = (pointer)0x0;
      bVar8 = ExtractArgumentsFromStack(this,(Vector<Variant> *)local_178);
      if (!bVar8) {
        ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::~vector
                  ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)local_178);
        bVar9 = 0;
        goto LAB_001f5822;
      }
      paVar1 = &local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (data,&local_70);
      local_1e0._0_8_ = local_1e0 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar1) {
        local_1e0._24_8_ = local_70.field_2._8_8_;
      }
      else {
        local_1e0._0_8_ = local_70._M_dataplus._M_p;
      }
      local_1e0._17_7_ = local_70.field_2._M_allocated_capacity._1_7_;
      local_1e0[0x10] = local_70.field_2._M_local_buf[0];
      local_1e0._8_8_ = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      if (instruction == TransformFnc) {
        this_00 = (this->expression_interface).data_model;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        if (this_00 != (DataModel *)0x0) {
          bVar8 = DataModel::CallTransform
                            (this_00,(String *)local_1e0,(VariantList *)local_178,&this->R);
          goto LAB_001f5c7c;
        }
LAB_001f5c88:
        local_198._M_allocated_capacity = (size_type)&local_188;
        local_198._8_8_ = 0;
        local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
        if (local_178._8_8_ != local_178._0_8_) {
          pDVar2 = (pointer)(local_150 + 0x10);
          lVar16 = 0;
          uVar11 = 0;
          do {
            local_150._8_8_ = (pointer)0x0;
            local_150[0x10] = '\0';
            local_150._0_8_ = pDVar2;
            Variant::
            GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((Variant *)(local_178._0_8_ + lVar16),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150);
            if ((pointer)local_150._0_8_ == pDVar2) {
              local_1b8._24_8_ = local_150._24_8_;
              local_150._0_8_ = (pointer)(local_1b8 + 0x10);
            }
            local_1b8._17_7_ = local_150._17_7_;
            local_1b8[0x10] = local_150[0x10];
            local_1b8._8_8_ = local_150._8_8_;
            local_150._8_8_ = 0;
            local_150[0x10] = '\0';
            local_1b8._0_8_ = local_150._0_8_;
            pDVar6 = (pointer)local_150._0_8_;
            local_150._0_8_ = pDVar2;
            ::std::__cxx11::string::_M_append(local_198._M_local_buf,(ulong)pDVar6);
            if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((pointer)local_150._0_8_ != pDVar2) {
              operator_delete((void *)local_150._0_8_,CONCAT71(local_150._17_7_,local_150[0x10]) + 1
                             );
            }
            uVar14 = ((long)(local_178._8_8_ - local_178._0_8_) >> 3) * -0x3333333333333333;
            if (uVar11 < uVar14 - 1) {
              ::std::__cxx11::string::append(local_198._M_local_buf);
              uVar14 = ((long)(local_178._8_8_ - local_178._0_8_) >> 3) * -0x3333333333333333;
            }
            uVar11 = uVar11 + 1;
            lVar16 = lVar16 + 0x28;
          } while (uVar11 < uVar14);
        }
        pcVar12 = "event callback";
        if (instruction == TransformFnc) {
          pcVar12 = "transform function";
        }
        CreateString_abi_cxx11_
                  ((String *)local_1b8,"Failed to execute %s: %s(%s)",pcVar12,local_1e0._0_8_,
                   local_198._M_allocated_capacity);
        bVar8 = Error(this,(String *)local_1b8);
        this = (DataInterpreter *)(ulong)bVar8;
        if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_allocated_capacity != &local_188) {
          operator_delete((void *)local_198._M_allocated_capacity,
                          local_188._M_allocated_capacity + 1);
        }
        bVar8 = false;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)paVar1;
        bVar8 = DataExpressionInterface::EventCallback
                          (&this->expression_interface,(String *)local_1e0,(VariantList *)local_178)
        ;
LAB_001f5c7c:
        if (bVar8 == false) goto LAB_001f5c88;
        bVar8 = true;
      }
      bVar9 = (byte)this;
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::~vector
                ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)local_178);
      if (!bVar8) goto LAB_001f5822;
      break;
    case GreaterEq:
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
      uVar15 = local_1e0._0_8_;
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
      bVar8 = (double)uVar15 < (double)local_1e0._0_8_;
      goto LAB_001f57f5;
    case CastToInt:
      bVar8 = Variant::GetInto<int,_0>(&this->R,(int *)local_198._M_local_buf);
      if (bVar8) {
        Variant::Clear(&this->R);
        uVar13 = local_198._M_allocated_capacity._0_4_;
        goto LAB_001f56c0;
      }
      local_1e0._0_8_ = local_1e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Could not cast value to int.","");
      bVar9 = Error(this,(String *)local_1e0);
LAB_001f5ed6:
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
LAB_001f5ee6:
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      goto LAB_001f5822;
    case Jump:
switchD_001f522f_caseD_4a:
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<unsigned_long,_0>(data,(unsigned_long *)local_1e0);
      *next_instruction = local_1e0._0_8_;
      break;
    case LessEq:
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
      uVar15 = local_1e0._0_8_;
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
      bVar8 = (double)local_1e0._0_8_ < (double)uVar15;
LAB_001f57f5:
      value = (string)!bVar8;
      goto LAB_001f5808;
    case NotEqual:
      if (((this->L).type != STRING) && ((this->R).type != STRING)) {
        local_1e0._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
        uVar15 = local_1e0._0_8_;
        local_1e0._0_8_ = (pointer)0x0;
        Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
        bVar8 = (double)uVar15 != (double)local_1e0._0_8_;
        goto LAB_001f588d;
      }
      local_110._8_8_ = 0;
      local_100._M_local_buf[0] = '\0';
      local_110._M_allocated_capacity = (size_type)&local_100;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->L,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_allocated_capacity == &local_100) {
        local_188._8_8_ = local_100._8_8_;
        local_198._M_allocated_capacity = (size_type)&local_188;
      }
      else {
        local_198._M_allocated_capacity = local_110._M_allocated_capacity;
      }
      local_188._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
      local_188._M_local_buf[0] = local_100._M_local_buf[0];
      local_198._8_8_ = local_110._8_8_;
      local_110._8_8_ = 0;
      local_100._M_local_buf[0] = '\0';
      local_130._8_8_ = (pointer)0x0;
      local_120._M_local_buf[0] = '\0';
      local_130._M_allocated_capacity = (size_type)&local_120;
      local_110._M_allocated_capacity = (size_type)&local_100;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_130);
      uVar15 = local_130._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_allocated_capacity == &local_120) {
        local_1b8._24_8_ = local_120._8_8_;
        local_130._M_allocated_capacity = (size_type)(pointer)(local_1b8 + 0x10);
      }
      local_1b8._17_7_ = local_120._M_allocated_capacity._1_7_;
      local_1b8[0x10] = local_120._M_local_buf[0];
      local_1b8._8_8_ = local_130._8_8_;
      local_130._8_8_ = 0;
      local_120._M_local_buf[0] = '\0';
      bVar8 = true;
      local_1b8._0_8_ = local_130._M_allocated_capacity;
      uVar7 = &local_120;
      if (local_198._8_8_ == uVar15) {
        if ((pointer)uVar15 == (pointer)0x0) {
          bVar8 = false;
        }
        else {
          pDVar2 = (pointer)local_130._M_allocated_capacity;
          local_130._M_allocated_capacity = (size_type)&local_120;
          iVar10 = bcmp((void *)local_198._M_allocated_capacity,pDVar2,uVar15);
          bVar8 = iVar10 != 0;
          uVar7 = local_130._M_allocated_capacity;
        }
      }
      local_130._M_allocated_capacity = uVar7;
      local_1e0._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_1e0,bVar8);
      Variant::operator=(&this->R,(Variant *)local_1e0);
      Variant::~Variant((Variant *)local_1e0);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_allocated_capacity != &local_120) {
        operator_delete((void *)local_130._M_allocated_capacity,
                        CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_allocated_capacity != &local_100) {
        lVar16 = CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
        uVar15 = local_110._M_allocated_capacity;
        goto LAB_001f63c6;
      }
      break;
    case Push:
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::emplace_back<Rml::Variant>
                (&this->stack,&this->R);
      Variant::Clear(&this->R);
      break;
    case Variable:
      local_1e0._0_4_ = 0xffffffff;
      local_1e0._0_8_ = CONCAT44(uVar13,local_1e0._0_4_);
      Variant::GetInto<int,_0>(data,(int *)local_1e0);
      uVar11 = (ulong)(int)local_1e0._0_4_;
      pvVar3 = (this->addresses->
               super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(this->addresses->
                      super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
               -0x5555555555555555;
      if (uVar14 < uVar11 || uVar14 - uVar11 == 0) {
        local_1e0._0_8_ = local_1e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Variable address not found.","");
        bVar9 = Error(this,(String *)local_1e0);
        goto LAB_001f5ed6;
      }
      DataExpressionInterface::GetValue
                ((Variant *)local_1e0,&this->expression_interface,pvVar3 + uVar11);
      goto LAB_001f580d;
    case DynamicVariable:
      paVar1 = &local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&this->R,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar1) {
        local_188._8_8_ = local_50.field_2._8_8_;
        local_198._M_allocated_capacity = (size_type)&local_188;
      }
      else {
        local_198._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
      }
      local_188._M_allocated_capacity._1_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      local_188._M_local_buf[0] = local_50.field_2._M_local_buf[0];
      local_198._8_8_ = local_50._M_string_length;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      DataExpressionInterface::ParseAddress
                ((DataAddress *)local_1b8,&this->expression_interface,(String *)&local_198);
      if (local_1b8._0_8_ == local_1b8._8_8_) {
        local_1e0._0_8_ = local_1e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Variable address not found.","");
        bVar8 = Error(this,(String *)local_1e0);
        this = (DataInterpreter *)(ulong)bVar8;
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
        }
      }
      else {
        DataExpressionInterface::GetValue
                  ((Variant *)local_1e0,&this->expression_interface,(DataAddress *)local_1b8);
        Variant::operator=(&this->R,(Variant *)local_1e0);
        Variant::~Variant((Variant *)local_1e0);
      }
      bVar9 = (byte)this;
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_1b8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1)
        ;
      }
      if (local_1b8._0_8_ == local_1b8._8_8_) goto LAB_001f5822;
      break;
    case JumpIfZero:
      local_1e0._0_8_ = (ulong)(uint7)local_1e0._1_7_ << 8;
      Variant::GetInto<bool,_0>(&this->R,(bool *)local_1e0);
      if (local_1e0[0] == (string)0x0) goto switchD_001f522f_caseD_4a;
      break;
    default:
      if (instruction != Pop) {
        if (instruction == Or) {
          local_1e0._0_8_ = (ulong)(uint7)local_1e0._1_7_ << 8;
          Variant::GetInto<bool,_0>(&this->L,(bool *)local_1e0);
          value = (string)0x1;
          if (local_1e0[0] == (string)0x0) {
            local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
            Variant::GetInto<bool,_0>(&this->R,(bool *)local_1e0);
            value = local_1e0[0];
          }
          goto LAB_001f5808;
        }
        goto switchD_001f522f_caseD_3f;
      }
      if ((this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_1e0._0_8_ = local_1e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"Cannot pop stack, it is empty.","");
        bVar9 = Error(this,(String *)local_1e0);
        goto LAB_001f5ed6;
      }
      local_1e0._0_4_ = 0xffffffff;
      local_1e0._0_8_ = CONCAT44(uVar13,local_1e0._0_4_);
      Variant::GetInto<int,_0>(data,(int *)local_1e0);
      if (local_1e0._0_4_ != 1) {
        if (local_1e0._0_4_ == 0) {
          pVVar4 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          this_01 = this;
          goto LAB_001f624d;
        }
        CreateString_abi_cxx11_((String *)local_1e0,"Invalid register %d.");
        bVar9 = Error(this,(String *)local_1e0);
        if ((undefined1 *)local_1e0._0_8_ == local_1e0 + 0x10) goto LAB_001f5822;
        goto LAB_001f5ee6;
      }
      pVVar4 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl
               .super__Vector_impl_data._M_finish;
      this_01 = (DataInterpreter *)&this->L;
LAB_001f624d:
      Variant::operator=(&this_01->R,pVVar4 + -1);
      other = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
      (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = other;
      goto LAB_001f581b;
    }
    goto LAB_001f5820;
  }
  switch(instruction) {
  case Not:
    local_1e0._0_8_ = (ulong)(uint7)local_1e0._1_7_ << 8;
    Variant::GetInto<bool,_0>(&this->R,(bool *)local_1e0);
    value = (string)((byte)local_1e0[0] ^ 1);
    goto LAB_001f5808;
  default:
    goto switchD_001f522f_caseD_3f;
  case NumArguments:
    local_1e0._0_4_ = 0xffffffff;
    local_1e0._0_8_ = CONCAT44(uVar13,local_1e0._0_4_);
    Variant::GetInto<int,_0>(data,(int *)local_1e0);
    uVar13 = local_1e0._0_4_;
    Variant::Clear(&this->R);
LAB_001f56c0:
    Variant::Set(&this->R,uVar13);
    goto LAB_001f5820;
  case And:
    local_1e0._0_8_ = (ulong)(uint7)local_1e0._1_7_ << 8;
    Variant::GetInto<bool,_0>(&this->L,(bool *)local_1e0);
    if (local_1e0[0] == (string)0x1) {
      local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
      Variant::GetInto<bool,_0>(&this->R,(bool *)local_1e0);
      value = local_1e0[0];
    }
    else {
      value = (string)0x0;
    }
LAB_001f5808:
    local_1e0._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_1e0,(bool)value);
    goto LAB_001f580d;
  case Multiply:
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
    uVar15 = local_1e0._0_8_;
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
    value_00 = (double)uVar15 * (double)local_1e0._0_8_;
    break;
  case Add:
    if (((this->L).type != STRING) && ((this->R).type != STRING)) {
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
      uVar15 = local_1e0._0_8_;
      local_1e0._0_8_ = (pointer)0x0;
      Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
      value_00 = (double)uVar15 + (double)local_1e0._0_8_;
      break;
    }
    paVar1 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&this->L,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar1) {
      local_1b8._24_8_ = local_90.field_2._8_8_;
      local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
    }
    else {
      local_1b8._0_8_ = local_90._M_dataplus._M_p;
    }
    local_1b8._17_7_ = local_90.field_2._M_allocated_capacity._1_7_;
    local_1b8[0x10] = local_90.field_2._M_local_buf[0];
    local_1b8._8_8_ = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    pVVar4 = (pointer)(local_b0 + 0x10);
    local_b0._8_8_ = (pointer)0x0;
    local_b0[0x10] = '\0';
    local_b0._0_8_ = pVVar4;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    Variant::
    GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&this->R,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b0);
    if ((pointer)local_b0._0_8_ == pVVar4) {
      local_178._24_8_ = local_b0._24_8_;
      local_178._0_8_ = (pointer)(local_178 + 0x10);
    }
    else {
      local_178._0_8_ = local_b0._0_8_;
    }
    local_178._17_7_ = local_b0._17_7_;
    local_178[0x10] = local_b0[0x10];
    local_178._8_8_ = local_b0._8_8_;
    local_b0._8_8_ = 0;
    local_b0[0x10] = '\0';
    local_b0._0_8_ = pVVar4;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                    );
    local_1e0._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_1e0,(String *)&local_198);
    Variant::operator=(&this->R,(Variant *)local_1e0);
    Variant::~Variant((Variant *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1);
    }
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
    }
    if ((pointer)local_b0._0_8_ != pVVar4) {
      operator_delete((void *)local_b0._0_8_,CONCAT71(local_b0._17_7_,local_b0[0x10]) + 1);
    }
    if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      lVar16 = CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                        local_90.field_2._M_local_buf[0]);
      uVar15 = local_90._M_dataplus._M_p;
      goto LAB_001f63c6;
    }
    goto LAB_001f5820;
  case Subtract:
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
    uVar15 = local_1e0._0_8_;
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
    value_00 = (double)uVar15 - (double)local_1e0._0_8_;
    break;
  case Divide:
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->L,(double *)local_1e0);
    uVar15 = local_1e0._0_8_;
    local_1e0._0_8_ = (pointer)0x0;
    Variant::GetInto<double,_0>(&this->R,(double *)local_1e0);
    value_00 = (double)uVar15 / (double)local_1e0._0_8_;
  }
  local_1e0._0_8_ = (pointer)0x2d;
  Variant::Set((Variant *)local_1e0,value_00);
LAB_001f580d:
  other = (Variant *)local_1e0;
  Variant::operator=(&this->R,other);
LAB_001f581b:
  Variant::~Variant(other);
LAB_001f5820:
  bVar9 = 1;
LAB_001f5822:
  return (bool)(bVar9 & 1);
}

Assistant:

bool Execute(const Instruction instruction, const Variant& data, size_t& next_instruction)
	{
		auto AnyString = [](const Variant& v1, const Variant& v2) { return v1.GetType() == Variant::STRING || v2.GetType() == Variant::STRING; };

		switch (instruction)
		{
		case Instruction::Push:
		{
			stack.push_back(std::move(R));
			R.Clear();
		}
		break;
		case Instruction::Pop:
		{
			if (stack.empty())
				return Error("Cannot pop stack, it is empty.");

			Register reg = Register(data.Get<int>(-1));
			switch (reg)
			{
				// clang-format off
			case Register::R:  R = stack.back(); stack.pop_back(); break;
			case Register::L:  L = stack.back(); stack.pop_back(); break;
				// clang-format on
			default: return Error(CreateString("Invalid register %d.", int(reg)));
			}
		}
		break;
		case Instruction::Literal:
		{
			R = data;
		}
		break;
		case Instruction::DynamicVariable:
		{
			auto str = R.Get<String>();
			auto address = expression_interface.ParseAddress(str);
			if (address.empty())
				return Error("Variable address not found.");
			R = expression_interface.GetValue(address);
		}
		break;
		case Instruction::Variable:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
				R = expression_interface.GetValue(addresses[variable_index]);
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::Add:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() + R.Get<String>());
			else
				R = Variant(L.Get<double>() + R.Get<double>());
		}
		break;
			// clang-format off
		case Instruction::Subtract:  R = Variant(L.Get<double>() - R.Get<double>());  break;
		case Instruction::Multiply:  R = Variant(L.Get<double>() * R.Get<double>());  break;
		case Instruction::Divide:    R = Variant(L.Get<double>() / R.Get<double>());  break;
		case Instruction::Not:       R = Variant(!R.Get<bool>());                     break;
		case Instruction::And:       R = Variant(L.Get<bool>() && R.Get<bool>());     break;
		case Instruction::Or:        R = Variant(L.Get<bool>() || R.Get<bool>());     break;
		case Instruction::Less:      R = Variant(L.Get<double>() < R.Get<double>());  break;
		case Instruction::LessEq:    R = Variant(L.Get<double>() <= R.Get<double>()); break;
		case Instruction::Greater:   R = Variant(L.Get<double>() > R.Get<double>());  break;
		case Instruction::GreaterEq: R = Variant(L.Get<double>() >= R.Get<double>()); break;
			// clang-format on
		case Instruction::Equal:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() == R.Get<String>());
			else
				R = Variant(L.Get<double>() == R.Get<double>());
		}
		break;
		case Instruction::NotEqual:
		{
			if (AnyString(L, R))
				R = Variant(L.Get<String>() != R.Get<String>());
			else
				R = Variant(L.Get<double>() != R.Get<double>());
		}
		break;
		case Instruction::NumArguments:
		{
			const int num_arguments = data.Get<int>(-1);
			R = num_arguments;
		}
		break;
		case Instruction::TransformFnc:
		case Instruction::EventFnc:
		{
			Vector<Variant> arguments;
			if (!ExtractArgumentsFromStack(arguments))
				return false;

			const String function_name = data.Get<String>();
			const bool result = (instruction == Instruction::TransformFnc ? expression_interface.CallTransform(function_name, arguments, R)
																		  : expression_interface.EventCallback(function_name, arguments));
			if (!result)
			{
				String arguments_str;
				for (size_t i = 0; i < arguments.size(); i++)
				{
					arguments_str += arguments[i].Get<String>();
					if (i < arguments.size() - 1)
						arguments_str += ", ";
				}
				return Error(
					CreateString("Failed to execute %s: %s(%s)", instruction == Instruction::TransformFnc ? "transform function" : "event callback",
						function_name.c_str(), arguments_str.c_str()));
			}
		}
		break;
		case Instruction::Assign:
		{
			size_t variable_index = size_t(data.Get<int>(-1));
			if (variable_index < addresses.size())
			{
				if (!expression_interface.SetValue(addresses[variable_index], R))
					return Error("Could not assign to variable.");
			}
			else
				return Error("Variable address not found.");
		}
		break;
		case Instruction::CastToInt:
		{
			int tmp;
			if (!R.GetInto(tmp))
				return Error("Could not cast value to int.");
			else
				R = tmp;
		}
		break;
		case Instruction::JumpIfZero:
		{
			if (!R.Get<bool>())
				next_instruction = data.Get<size_t>(0);
		}
		break;
		case Instruction::Jump:
		{
			next_instruction = data.Get<size_t>(0);
		}
		break;
		default: RMLUI_ERRORMSG("Instruction not implemented."); break;
		}
		return true;
	}